

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fountain.c
# Opt level: O2

void dowatersnakes(void)

{
  boolean bVar1;
  uint uVar2;
  monst *mtmp;
  trap *ptVar3;
  int iVar4;
  char *pcVar5;
  
  uVar2 = mt_random();
  if ((mvitals[0xde].mvflags & 3) != 0) {
    pline("The fountain bubbles furiously for a moment, then calms.");
    return;
  }
  if (u.uprops[0x1e].intrinsic != 0) {
LAB_0019a4bc:
    if (ublindf != (obj *)0x0) {
LAB_0019a4c1:
      if (ublindf->oartifact == '\x1d') goto LAB_0019a4f8;
    }
    You_hear("something hissing!");
    goto LAB_0019a55f;
  }
  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0019a4c1;
  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0019a4bc;
LAB_0019a4f8:
  pcVar5 = "snakes";
  if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
    if (u.umonnum != u.umonster) {
      bVar1 = dmgtype(youmonst.data,0x24);
      if (bVar1 != '\0') goto LAB_0019a54e;
    }
    pcVar5 = rndmonnam();
    pcVar5 = makeplural(pcVar5);
  }
LAB_0019a54e:
  pline("An endless stream of %s pours forth!",pcVar5);
LAB_0019a55f:
  for (iVar4 = uVar2 % 5 + 2; 0 < iVar4; iVar4 = iVar4 + -1) {
    mtmp = makemon(mons + 0xde,level,(int)u.ux,(int)u.uy,0);
    if (mtmp != (monst *)0x0) {
      ptVar3 = t_at(level,(int)mtmp->mx,(int)mtmp->my);
      if (ptVar3 != (trap *)0x0) {
        mintrap(mtmp);
      }
    }
  }
  return;
}

Assistant:

static void dowatersnakes(void) /* Fountain of snakes! */
{
    int num = rn1(5,2);
    struct monst *mtmp;

    if (!(mvitals[PM_WATER_MOCCASIN].mvflags & G_GONE)) {
	if (!Blind)
	    pline("An endless stream of %s pours forth!",
		  Hallucination ? makeplural(rndmonnam()) : "snakes");
	else
	    You_hear("something hissing!");
	while (num-- > 0)
	    if ((mtmp = makemon(&mons[PM_WATER_MOCCASIN], level,
			u.ux, u.uy, NO_MM_FLAGS)) && t_at(level, mtmp->mx, mtmp->my))
		mintrap(mtmp);
    } else
	pline("The fountain bubbles furiously for a moment, then calms.");
}